

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::DiscardEverythingFallback
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint32_t tag_00;
  uint *puVar1;
  uint32_t tag;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  uint32_t has_bits_offset;
  
  msg_local = (MessageLite *)data.field_0;
  if (table->has_bits_offset != 0) {
    puVar1 = RefAt<unsigned_int>(msg,(ulong)(uint)table->has_bits_offset);
    *puVar1 = (uint)hasbits | *puVar1;
  }
  tag_00 = TcFieldData::tag((TcFieldData *)&msg_local);
  if (((tag_00 & 7) == 4) || (tag_00 == 0)) {
    EpsCopyInputStream::SetLastTag(&ctx->super_EpsCopyInputStream,tag_00);
    data_local.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
  }
  else {
    data_local.field_0 =
         (anon_union_8_1_898a9ca8_for_TcFieldData_0)UnknownFieldParse(tag_00,(string *)0x0,ptr,ctx);
  }
  return (char *)data_local.field_0.data;
}

Assistant:

const char* TcParser::DiscardEverythingFallback(PROTOBUF_TC_PARAM_DECL) {
  SyncHasbits(msg, hasbits, table);
  uint32_t tag = data.tag();
  if ((tag & 7) == WireFormatLite::WIRETYPE_END_GROUP || tag == 0) {
    ctx->SetLastTag(tag);
    return ptr;
  }
  return UnknownFieldParse(tag, nullptr, ptr, ctx);
}